

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1corr.c
# Opt level: O3

void test_ffffffff_and_friends(void)

{
  ulong uVar1;
  void *pvVar2;
  void *pvVar3;
  char *pcVar4;
  undefined8 uVar5;
  long lVar6;
  void *pvVar7;
  
  lVar6 = 0;
  pvVar2 = (*hm_new)();
  do {
    (*hm_insert)(pvVar2,*(ulong *)((long)test_ffffffff_and_friends::vals + lVar6),
                 (void *)~*(ulong *)((long)test_ffffffff_and_friends::vals + lVar6),0);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x38);
  lVar6 = 0;
  do {
    uVar1 = *(ulong *)((long)test_ffffffff_and_friends::vals + lVar6);
    pvVar3 = (*hm_get)(pvVar2,uVar1);
    pvVar7 = (void *)~uVar1;
    if (pvVar3 != pvVar7) {
      pvVar2 = (*hm_get)(pvVar2,uVar1);
      pcVar4 = "hm_get(c, vals[i])";
      uVar5 = 0x68;
      goto LAB_00101a62;
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x38);
  lVar6 = 0;
  while( true ) {
    uVar1 = *(ulong *)((long)test_ffffffff_and_friends::vals + lVar6);
    pvVar3 = (*hm_remove)(pvVar2,uVar1);
    pvVar7 = (void *)~uVar1;
    if (pvVar3 != pvVar7) break;
    lVar6 = lVar6 + 8;
    if (lVar6 == 0x38) {
      (*hm_delete)(pvVar2);
      return;
    }
  }
  pvVar2 = (*hm_remove)(pvVar2,uVar1);
  pcVar4 = "hm_remove(c, vals[i])";
  uVar5 = 0x6a;
LAB_00101a62:
  printf(anon_var_dwarf_29b,pcVar4,pvVar2,"(void*)~vals[i]",pvVar7,uVar5);
  bad = 1;
  exit(1);
}

Assistant:

static void test_ffffffff_and_friends()
{
    static word vals[]=
    {
        0,
        0x7fffffff,
        0x80000000,
        0xffffffff,
#if __SIZEOF_SIZE_T__ == 8
        0x7fffffffFFFFFFFF,
        0x8000000000000000,
        0xFfffffffFFFFFFFF,
#endif
    };

    void *c = hm_new();
    for (int i=0; i<ARRAYSZ(vals); i++)
        hm_insert(c, vals[i], (void*)~vals[i], 0);
    for (int i=0; i<ARRAYSZ(vals); i++)
        CHECK(hm_get(c, vals[i]), (void*)~vals[i]);
    for (int i=0; i<ARRAYSZ(vals); i++)
        CHECK(hm_remove(c, vals[i]), (void*)~vals[i]);
    hm_delete(c);
}